

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

void __thiscall Highs::invalidateModelStatusSolutionAndInfo(Highs *this)

{
  this->model_status_ = kMin;
  invalidateSolution(this);
  HighsRanging::invalidate(&this->ranging_);
  HighsInfo::invalidate(&this->info_);
  HighsIis::invalidate(&this->iis_);
  return;
}

Assistant:

void Highs::invalidateModelStatusSolutionAndInfo() {
  invalidateModelStatus();
  invalidateSolution();
  invalidateRanging();
  invalidateInfo();
  invalidateIis();
}